

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O0

string * __thiscall
GeneratorExpressionContent::Evaluate_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppcVar4;
  string local_1b8;
  undefined1 local_198 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  undefined1 local_160 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  cmGeneratorExpressionNode *local_a0;
  cmGeneratorExpressionNode *node;
  string local_88 [32];
  cmGeneratorExpressionEvaluator *local_68;
  cmGeneratorExpressionEvaluator *pExprEval;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *__range1;
  string identifier;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  GeneratorExpressionContent *this_local;
  
  identifier.field_2._8_8_ = dagChecker;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
           ::begin(&this->IdentifierChildren);
  pExprEval = (cmGeneratorExpressionEvaluator *)
              std::
              vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ::end(&this->IdentifierChildren);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                                *)&pExprEval);
    if (!bVar1) {
      local_a0 = cmGeneratorExpressionNode::GetNode((string *)&__range1);
      if (local_a0 == (cmGeneratorExpressionNode *)0x0) {
        GetOriginalExpression_abi_cxx11_(&local_c0,this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Expression did not evaluate to a known generator expression"
                   ,&local_e1);
        reportError(context,&local_c0,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        node._0_4_ = 1;
      }
      else {
        uVar2 = (*local_a0->_vptr_cmGeneratorExpressionNode[2])();
        if ((uVar2 & 1) == 0) {
          iVar3 = (*local_a0->_vptr_cmGeneratorExpressionNode[5])();
          if ((iVar3 == 1) &&
             (uVar2 = (*local_a0->_vptr_cmGeneratorExpressionNode[4])(), (uVar2 & 1) != 0)) {
            bVar1 = std::
                    vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                    ::empty(&this->ParamChildren);
            if (bVar1) {
              GetOriginalExpression_abi_cxx11_(&local_108,this);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &parameters_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"$<",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range1);
              std::operator+(&local_128,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &parameters_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "> expression requires a parameter.");
              reportError(context,&local_108,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::~string
                        ((string *)
                         &parameters_1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string((string *)&local_108);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_160);
            EvaluateParameters((string *)
                               &parameters.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,local_a0,
                               (string *)&__range1,context,
                               (cmGeneratorExpressionDAGChecker *)identifier.field_2._8_8_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_160);
            std::__cxx11::string::~string
                      ((string *)
                       &parameters.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_160);
          }
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          node._0_4_ = 1;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_198);
          EvaluateParameters(&local_1b8,this,local_a0,(string *)&__range1,context,
                             (cmGeneratorExpressionDAGChecker *)identifier.field_2._8_8_,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          if ((context->HadError & 1U) == 0) {
            (*local_a0->_vptr_cmGeneratorExpressionNode[6])
                      (__return_storage_ptr__,local_a0,local_198,context,this,
                       identifier.field_2._8_8_);
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__);
          }
          node._0_4_ = 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_198);
        }
      }
LAB_006079a4:
      std::__cxx11::string::~string((string *)&__range1);
      return __return_storage_ptr__;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&__end1);
    local_68 = *ppcVar4;
    (*local_68->_vptr_cmGeneratorExpressionEvaluator[3])
              (local_88,local_68,context,identifier.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)&__range1,local_88);
    std::__cxx11::string::~string(local_88);
    if ((context->HadError & 1U) != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      node._0_4_ = 1;
      goto LAB_006079a4;
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string GeneratorExpressionContent::Evaluate(
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker) const
{
  std::string identifier;
  {
    for (cmGeneratorExpressionEvaluator* pExprEval :
         this->IdentifierChildren) {
      identifier += pExprEval->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
  }

  const cmGeneratorExpressionNode* node =
    cmGeneratorExpressionNode::GetNode(identifier);

  if (!node) {
    reportError(context, this->GetOriginalExpression(),
                "Expression did not evaluate to a known generator expression");
    return std::string();
  }

  if (!node->GeneratesContent()) {
    if (node->NumExpectedParameters() == 1 &&
        node->AcceptsArbitraryContentParameter()) {
      if (this->ParamChildren.empty()) {
        reportError(context, this->GetOriginalExpression(),
                    "$<" + identifier + "> expression requires a parameter.");
      }
    } else {
      std::vector<std::string> parameters;
      this->EvaluateParameters(node, identifier, context, dagChecker,
                               parameters);
    }
    return std::string();
  }

  std::vector<std::string> parameters;
  this->EvaluateParameters(node, identifier, context, dagChecker, parameters);
  if (context->HadError) {
    return std::string();
  }

  return node->Evaluate(parameters, context, this, dagChecker);
}